

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl.h
# Opt level: O0

void __thiscall flatbuffers::Definition::Definition(Definition *this)

{
  Definition *this_local;
  
  std::__cxx11::string::string((string *)this);
  std::__cxx11::string::string((string *)&this->file);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->doc_comment);
  SymbolTable<flatbuffers::Value>::SymbolTable(&this->attributes);
  this->generated = false;
  this->defined_namespace = (Namespace *)0x0;
  this->serialized_location = 0;
  this->index = -1;
  this->refcount = 1;
  this->declaration_file = (string *)0x0;
  return;
}

Assistant:

Definition()
      : generated(false),
        defined_namespace(nullptr),
        serialized_location(0),
        index(-1),
        refcount(1),
        declaration_file(nullptr) {}